

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mutex.h
# Opt level: O2

void __thiscall FIX::Mutex::unlock(Mutex *this)

{
  int iVar1;
  
  iVar1 = this->m_count;
  this->m_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  this->m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void unlock() {
#ifdef _MSC_VER
    LeaveCriticalSection(&m_mutex);
#else
    if (m_count > 1) {
      m_count--;
      return;
    }
    --m_count;
    m_threadID = 0;
    pthread_mutex_unlock(&m_mutex);
#endif
  }